

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radial_factory.hpp
# Opt level: O0

RadialQuad IntegratorXX::radial_from_string(string *name)

{
  bool bVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  runtime_error *this;
  string *name_local;
  
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  __result._M_current = (char *)std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
            (__first,__last,__result,toupper);
  bVar1 = std::operator==(name,"BECKE");
  if (bVar1) {
    name_local._4_4_ = Becke;
  }
  else {
    bVar1 = std::operator==(name,"MURAKNOWLES");
    if (bVar1) {
      name_local._4_4_ = MuraKnowles;
    }
    else {
      bVar1 = std::operator==(name,"MK");
      if (bVar1) {
        name_local._4_4_ = MuraKnowles;
      }
      else {
        bVar1 = std::operator==(name,"MURRAYHANDYLAMING");
        if (bVar1) {
          name_local._4_4_ = MurrayHandyLaming;
        }
        else {
          bVar1 = std::operator==(name,"MHL");
          if (bVar1) {
            name_local._4_4_ = MurrayHandyLaming;
          }
          else {
            bVar1 = std::operator==(name,"TREUTLERAHLRICHS");
            if (bVar1) {
              name_local._4_4_ = TreutlerAhlrichs;
            }
            else {
              bVar1 = std::operator==(name,"TA");
              if (!bVar1) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this,"Unrecognized Radial Quadrature");
                __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
              }
              name_local._4_4_ = TreutlerAhlrichs;
            }
          }
        }
      }
    }
  }
  return name_local._4_4_;
}

Assistant:

RadialQuad radial_from_string(std::string name) {
  std::transform(name.begin(), name.end(), name.begin(), ::toupper);
  if(name == "BECKE")             return RadialQuad::Becke;
  if(name == "MURAKNOWLES")       return RadialQuad::MuraKnowles;
  if(name == "MK")                return RadialQuad::MuraKnowles;
  if(name == "MURRAYHANDYLAMING") return RadialQuad::MurrayHandyLaming;
  if(name == "MHL")               return RadialQuad::MurrayHandyLaming;
  if(name == "TREUTLERAHLRICHS")  return RadialQuad::TreutlerAhlrichs;
  if(name == "TA")                return RadialQuad::TreutlerAhlrichs;

  throw std::runtime_error("Unrecognized Radial Quadrature");
}